

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditField.cpp
# Opt level: O0

double __thiscall CreditField::AddCredit(CreditField *this,double *credit)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  ostream *poVar6;
  undefined1 *puVar7;
  istringstream local_358 [8];
  istringstream istr_1;
  istringstream local_1d8 [8];
  istringstream istr;
  double local_58;
  double addCreditConvert;
  seconds duration;
  int i;
  string local_38 [8];
  string addCredit;
  double *credit_local;
  CreditField *this_local;
  
  addCredit.field_2._8_8_ = credit;
  std::__cxx11::string::string(local_38);
  std::operator<<((ostream *)&std::cout,"Insert Credit: ");
  std::operator>>((istream *)&std::cin,local_38);
  duration.__r._0_4_ = 0;
  while( true ) {
    uVar3 = (ulong)(int)duration.__r;
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= uVar3) break;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    iVar2 = isdigit((int)*pcVar5);
    if (iVar2 == 0) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      if (*pcVar5 != '.') {
        poVar6 = std::operator<<((ostream *)&std::cout,"counterfeit!");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        addCreditConvert = 1.48219693752374e-323;
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                  ((duration<long,_std::ratio<1L,_1L>_> *)&addCreditConvert);
        puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_38);
        *puVar7 = 0;
        AddCredit(this,(double *)addCredit.field_2._8_8_);
      }
    }
    duration.__r._0_4_ = (int)duration.__r + 1;
  }
  std::__cxx11::istringstream::istringstream(local_1d8,local_38,8);
  std::istream::operator>>((istream *)local_1d8,&local_58);
  while (10000.0 < local_58) {
    poVar6 = std::operator<<((ostream *)&std::cout,"The Limit is: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,10000.0);
    poVar6 = std::operator<<(poVar6," Euro!");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)&std::cout,"Invalid Input!");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"Insert Credit To Play:");
    std::operator>>((istream *)&std::cin,local_38);
    std::__cxx11::istringstream::istringstream(local_358,local_38,8);
    std::istream::operator>>((istream *)local_358,&local_58);
    std::__cxx11::istringstream::~istringstream(local_358);
  }
  *(double *)addCredit.field_2._8_8_ = *(double *)addCredit.field_2._8_8_ + local_58;
  poVar6 = std::operator<<((ostream *)&std::cout,"---------------------------");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Current Credit: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(double *)addCredit.field_2._8_8_);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"---------------------------");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  dVar1 = *(double *)addCredit.field_2._8_8_;
  std::__cxx11::istringstream::~istringstream(local_1d8);
  std::__cxx11::string::~string(local_38);
  return dVar1;
}

Assistant:

double CreditField::AddCredit(double &credit) {
	std::string addCredit;
	std::cout << "Insert Credit: ";
	std::cin >> addCredit;
	for (int i = 0; i < addCredit.size(); i++) {
		if (!isdigit(addCredit[i]) && addCredit[i] != '.') {
			std::cout << "counterfeit!" << std::endl;
			std::chrono::seconds duration(3);
			std::this_thread::sleep_for(duration);
			addCredit[0] = 0;
			AddCredit(credit);
			
			//exit(0);
		}
	}
	double addCreditConvert;
	std::istringstream istr(addCredit);
	istr >> addCreditConvert;
	while (addCreditConvert > addCreditLimit) {
		std::cout << "The Limit is: " << addCreditLimit<< " Euro!" << std::endl;
		std::cout << "Invalid Input!" << std::endl;
		std::cout << "Insert Credit To Play:";
		std::cin >> addCredit;
		std::istringstream istr(addCredit);
		istr >> addCreditConvert;
	}
	credit += addCreditConvert;
	std::cout << "---------------------------" << std::endl;
	std::cout << "Current Credit: " << credit << std::endl;
	std::cout << "---------------------------" << std::endl;
	return credit;
}